

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml_reporter_tests.c
# Opt level: O2

void LibXmlReporter__will_report_a_failing_test_only_once(void)

{
  xmlChar *pxVar1;
  undefined8 uVar2;
  xmlNodePtr pxVar3;
  Constraint *pCVar4;
  char *pcVar5;
  va_list null_arguments;
  
  null_arguments[0].gp_offset = 0;
  null_arguments[0].fp_offset = 0;
  null_arguments[0].overflow_arg_area = (void *)0x0;
  null_arguments[0].reg_save_area = (void *)0x0;
  (*reporter->start_suite)(reporter,"suite_name",2);
  (*reporter->start_test)(reporter,"test_name");
  (*reporter->show_fail)(reporter,"file",2,"test_failure_message",null_arguments);
  (*reporter->show_fail)(reporter,"file",2,"other_message",null_arguments);
  (*reporter->finish_test)(reporter,"filename",0x29a,(char *)0x0);
  pcVar5 = "filename";
  (*reporter->finish_suite)(reporter,"filename",0x29a);
  uVar2 = xmlParseDoc(output);
  uVar2 = xmlDocGetRootElement(uVar2);
  uVar2 = xmlFirstElementChild(uVar2);
  pxVar3 = (xmlNodePtr)xmlFirstElementChild(uVar2);
  pxVar3 = xmlnode_find_sibling(pxVar3,pcVar5);
  pxVar1 = pxVar3->name;
  uVar2 = create_equal_to_string_constraint("failure","FAILURE");
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/libxml_reporter_tests.c"
               ,0x132,"failure->name",pxVar1,uVar2);
  pCVar4 = create_xmlNode_has_attribute_equal_to
                     ("message",(xmlChar *)"test_failure_message","\"test_failure_message\"");
  pcVar5 = (char *)0x133;
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/libxml_reporter_tests.c"
               ,0x133,"failure",pxVar3,pCVar4);
  pxVar3 = (xmlNodePtr)xmlNextElementSibling(pxVar3);
  pxVar3 = xmlnode_find_sibling(pxVar3,pcVar5);
  pCVar4 = create_xmlNode_has_attribute_equal_to
                     ("message",(xmlChar *)"other_message","\"other_message\"");
  pcVar5 = (char *)0x136;
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/libxml_reporter_tests.c"
               ,0x136,"failure",pxVar3,pCVar4);
  pxVar3 = (xmlNodePtr)xmlNextElementSibling(pxVar3);
  pxVar3 = xmlnode_find_sibling(pxVar3,pcVar5);
  uVar2 = create_is_null_constraint();
  assert_core_("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/libxml_reporter_tests.c"
               ,0x139,"failure",pxVar3,uVar2);
  return;
}

Assistant:

static void teardown_xml_reporter_tests(void) {
    //bad mojo when running tests in same process, as destroy_reporter also sets
    //context.reporter = NULL, thus breaking the next test to run
    destroy_reporter(reporter);
    if (NULL != output) {
        free(output);
        //need to set output to NULL to avoid second free in
        //subsequent call to setup_xml_reporter_tests->clear_output
        //when running tests in same process
        output = NULL;
    }
}